

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::
     functor_manager<boost::_bi::bind_t<void,_boost::_mfi::mf1<void,_boost::unit_test::test_observer,_unsigned_long>,_boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer_*>,_boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>_>_>_>
     ::manager(undefined8 *param_1,undefined8 *param_2,int param_3)

{
  bool bVar1;
  undefined8 *puVar2;
  type_info_t *ptVar3;
  functor_type *f_1;
  functor_type *new_f;
  functor_type *f;
  type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *rhs;
  type_info *in_stack_ffffffffffffffb0;
  stl_type_index local_48;
  type_info_t *local_40;
  void *local_38;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_1c = param_3;
  local_18 = param_2;
  local_10 = param_1;
  if (param_3 == 0) {
    local_28 = (undefined8 *)*param_1;
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = *local_28;
    puVar2[1] = local_28[1];
    puVar2[2] = local_28[2];
    puVar2[3] = local_28[3];
    *local_18 = puVar2;
  }
  else if (param_3 == 1) {
    *param_2 = *param_1;
    *param_1 = 0;
  }
  else if (param_3 == 2) {
    local_38 = (void *)*param_2;
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,0x20);
    }
    *local_18 = 0;
  }
  else if (param_3 == 3) {
    rhs = (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)*param_2;
    local_40 = (type_info_t *)
               typeindex::
               type_id<boost::_bi::bind_t<void,boost::_mfi::mf1<void,boost::unit_test::test_observer,unsigned_long>,boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer*>,boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>>>>
                         ();
    bVar1 = typeindex::operator==(in_stack_ffffffffffffffb0,rhs);
    if (bVar1) {
      *local_18 = *local_10;
    }
    else {
      *local_18 = 0;
    }
  }
  else {
    local_48.data_ =
         (type_info_t *)
         typeindex::
         type_id<boost::_bi::bind_t<void,boost::_mfi::mf1<void,boost::unit_test::test_observer,unsigned_long>,boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer*>,boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>>>>
                   ();
    ptVar3 = typeindex::stl_type_index::type_info(&local_48);
    *local_18 = ptVar3;
    *(undefined1 *)(local_18 + 1) = 0;
    *(undefined1 *)((long)local_18 + 9) = 0;
  }
  return;
}

Assistant:

static inline void
        manager(const function_buffer& in_buffer, function_buffer& out_buffer,
                functor_manager_operation_type op, mpl::false_)
        {
          if (op == clone_functor_tag) {
            // Clone the functor
            // GCC 2.95.3 gets the CV qualifiers wrong here, so we
            // can't do the static_cast that we should do.
            // jewillco: Changing this to static_cast because GCC 2.95.3 is
            // obsolete.
            const functor_type* f =
              static_cast<const functor_type*>(in_buffer.members.obj_ptr);
            functor_type* new_f = new functor_type(*f);
            out_buffer.members.obj_ptr = new_f;
          } else if (op == move_functor_tag) {
            out_buffer.members.obj_ptr = in_buffer.members.obj_ptr;
            in_buffer.members.obj_ptr = 0;
          } else if (op == destroy_functor_tag) {
            /* Cast from the void pointer to the functor pointer type */
            functor_type* f =
              static_cast<functor_type*>(out_buffer.members.obj_ptr);
            delete f;
            out_buffer.members.obj_ptr = 0;
          } else if (op == check_functor_type_tag) {
            if (*out_buffer.members.type.type == boost::typeindex::type_id<Functor>())
              out_buffer.members.obj_ptr = in_buffer.members.obj_ptr;
            else
              out_buffer.members.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.members.type.type = &boost::typeindex::type_id<Functor>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
          }
        }